

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::SharedBasicVarCase::iterate(SharedBasicVarCase *this)

{
  ostringstream *poVar1;
  DataType DVar2;
  Precision PVar3;
  GLint GVar4;
  int iVar5;
  GLuint index;
  GLint GVar6;
  GLint GVar7;
  GLint GVar8;
  deBool dVar9;
  GLenum GVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  long lVar11;
  glUniform1fvFunc *pp_Var12;
  glUniform1uivFunc *pp_Var13;
  glUniform1ivFunc *pp_Var14;
  void *pvVar15;
  glUniformMatrix2fvFunc *pp_Var16;
  TestError *this_00;
  ulong uVar17;
  char *description;
  GLuint GVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  Random rnd;
  Buffer outputBuffer;
  vector<float,_std::allocator<float>_> values;
  InterfaceBlockInfo outBlockInfo;
  allocator_type local_299;
  Functions *local_298;
  GLuint local_28c;
  glUniformMatrix4fvFunc *local_288;
  glUniformMatrix4fvFunc *local_280;
  glUniformMatrix4fvFunc *local_278;
  glUniformMatrix4fvFunc *local_270;
  glUniformMatrix4fvFunc *local_268;
  InterfaceVariableInfo local_260;
  ObjectWrapper local_210;
  undefined1 local_1f8 [16];
  pointer local_1e8;
  ios_base local_180 [264];
  InterfaceBlockInfo local_78;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  GVar18 = (this->m_program->m_program).m_program;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_210,(Functions *)CONCAT44(extraout_var_00,iVar5),traits);
  index = (*gl->getProgramResourceIndex)(GVar18,0x92e6,"Result");
  local_78.name._M_dataplus._M_p = (pointer)&local_78.name.field_2;
  local_78.name._M_string_length = 0;
  local_78.name.field_2._M_local_buf[0] = '\0';
  local_78.index = 0xffffffff;
  local_78.bufferBinding = 0;
  local_78.dataSize = 0;
  local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glu::getProgramInterfaceBlockInfo(gl,GVar18,0x92e6,index,&local_78);
  (*gl->useProgram)(GVar18);
  uVar21 = (this->m_workGroupSize).m_data[0];
  lVar11 = 0;
  do {
    uVar21 = uVar21 * (this->m_workGroupSize).m_data[lVar11 + 1];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  GVar6 = (*gl->getUniformLocation)(GVar18,"u_val[0]");
  GVar7 = (*gl->getUniformLocation)(GVar18,"u_ref[0]");
  local_28c = GVar18;
  GVar8 = (*gl->getUniformLocation)(GVar18,"u_numIters");
  iVar5 = glu::getDataTypeScalarSize(this->m_basicType);
  DVar2 = this->m_basicType;
  local_298 = gl;
  if (DVar2 - TYPE_FLOAT < 4) {
    iVar22 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar22 = 2;
    }
    iVar23 = (int)uVar21 / 2;
    if (iVar22 <= (int)uVar21 / 2) {
      iVar23 = iVar22;
    }
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_1f8,(long)(int)(iVar5 * uVar21),
               (allocator_type *)&local_260);
    uVar19 = (uint)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 2);
    if (0 < (int)uVar19) {
      uVar17 = 0;
      do {
        *(float *)((long)(qpTestLog **)local_1f8._0_8_ + uVar17 * 4) =
             (float)((int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff)
                          % (long)(iVar23 + iVar22 + 1)) - iVar23);
        uVar17 = uVar17 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar17);
    }
    iVar22 = 1;
    do {
      bVar24 = iVar22 == 0;
      iVar22 = iVar22 + -1;
      GVar4 = GVar6;
      if (bVar24) {
        GVar4 = GVar7;
      }
      pp_Var12 = &gl->uniform1fv;
      switch(iVar5) {
      case 1:
        break;
      case 2:
        pp_Var12 = &gl->uniform2fv;
        break;
      case 3:
        pp_Var12 = &gl->uniform3fv;
        break;
      case 4:
        pp_Var12 = &gl->uniform4fv;
        break;
      default:
        goto switchD_003b8c30_default;
      }
      (**pp_Var12)(GVar4,uVar21,(GLfloat *)local_1f8._0_8_);
switchD_003b8c30_default:
    } while (iVar22 == 0);
  }
  else if (DVar2 - TYPE_INT < 4) {
    iVar22 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar22 = 0x40;
    }
    iVar23 = (int)uVar21 / 2;
    if (iVar22 <= (int)uVar21 / 2) {
      iVar23 = iVar22;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1f8,(long)(int)(iVar5 * uVar21),
               (allocator_type *)&local_260);
    uVar19 = (uint)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 2);
    if (0 < (int)uVar19) {
      uVar17 = 0;
      do {
        *(int *)((long)(qpTestLog **)local_1f8._0_8_ + uVar17 * 4) =
             (int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) %
                  (long)(iVar23 + iVar22 + 1)) - iVar23;
        uVar17 = uVar17 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar17);
    }
    iVar22 = 1;
    do {
      bVar24 = iVar22 == 0;
      iVar22 = iVar22 + -1;
      GVar4 = GVar6;
      if (bVar24) {
        GVar4 = GVar7;
      }
      pp_Var14 = &gl->uniform1iv;
      switch(iVar5) {
      case 1:
        break;
      case 2:
        pp_Var14 = &gl->uniform2iv;
        break;
      case 3:
        pp_Var14 = &gl->uniform3iv;
        break;
      case 4:
        pp_Var14 = &gl->uniform4iv;
        break;
      default:
        goto switchD_003b8d41_default;
      }
      (**pp_Var14)(GVar4,uVar21,(GLint *)local_1f8._0_8_);
switchD_003b8d41_default:
    } while (iVar22 == 0);
  }
  else if (DVar2 - TYPE_UINT < 4) {
    PVar3 = this->m_precision;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f8,
               (long)(int)(iVar5 * uVar21),(allocator_type *)&local_260);
    uVar19 = (uint)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 2);
    if (0 < (int)uVar19) {
      uVar20 = 0x401;
      if (PVar3 == PRECISION_LOWP) {
        uVar20 = 0x81;
      }
      uVar17 = 0;
      do {
        *(int *)((long)(qpTestLog **)local_1f8._0_8_ + uVar17 * 4) =
             (int)((uVar17 & 0xffffffff) % (ulong)uVar20);
        uVar17 = uVar17 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar17);
    }
    iVar22 = 1;
    do {
      bVar24 = iVar22 == 0;
      iVar22 = iVar22 + -1;
      GVar4 = GVar6;
      if (bVar24) {
        GVar4 = GVar7;
      }
      pp_Var13 = &gl->uniform1uiv;
      switch(iVar5) {
      case 1:
        break;
      case 2:
        pp_Var13 = &gl->uniform2uiv;
        break;
      case 3:
        pp_Var13 = &gl->uniform3uiv;
        break;
      case 4:
        pp_Var13 = &gl->uniform4uiv;
        break;
      default:
        goto switchD_003b8e38_default;
      }
      (**pp_Var13)(GVar4,uVar21,(GLuint *)local_1f8._0_8_);
switchD_003b8e38_default:
    } while (iVar22 == 0);
  }
  else {
    if (3 < DVar2 - TYPE_BOOL) {
      if (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9) {
        iVar22 = 0x400;
        if (this->m_precision == PRECISION_LOWP) {
          iVar22 = 2;
        }
        iVar23 = (int)uVar21 / 2;
        if (iVar22 <= (int)uVar21 / 2) {
          iVar23 = iVar22;
        }
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_1f8,(long)(int)(iVar5 * uVar21),
                   (allocator_type *)&local_260);
        uVar19 = (uint)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 2);
        if (0 < (int)uVar19) {
          uVar17 = 0;
          do {
            *(float *)((long)(qpTestLog **)local_1f8._0_8_ + uVar17 * 4) =
                 (float)((int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                     uVar17 & 0xffffffff) % (long)(iVar23 + iVar22 + 1)) - iVar23);
            uVar17 = uVar17 + 1;
          } while ((uVar19 & 0x7fffffff) != uVar17);
        }
        local_288 = &gl->uniformMatrix4fv;
        local_268 = &gl->uniformMatrix3fv;
        local_270 = &gl->uniformMatrix3x2fv;
        local_278 = &gl->uniformMatrix2x4fv;
        local_280 = &gl->uniformMatrix2x3fv;
        iVar5 = 1;
        do {
          bVar24 = iVar5 == 0;
          iVar5 = iVar5 + -1;
          GVar4 = GVar6;
          if (bVar24) {
            GVar4 = GVar7;
          }
          pp_Var16 = &gl->uniformMatrix2fv;
          switch(this->m_basicType) {
          case TYPE_FLOAT_MAT2:
            break;
          case TYPE_FLOAT_MAT2X3:
            pp_Var16 = local_280;
            break;
          case TYPE_FLOAT_MAT2X4:
            pp_Var16 = local_278;
            break;
          case TYPE_FLOAT_MAT3X2:
            pp_Var16 = local_270;
            break;
          case TYPE_FLOAT_MAT3:
            pp_Var16 = local_268;
            break;
          case TYPE_FLOAT_MAT3X4:
            pp_Var16 = &gl->uniformMatrix3x4fv;
            break;
          case TYPE_FLOAT_MAT4X2:
            pp_Var16 = &gl->uniformMatrix4x2fv;
            break;
          case TYPE_FLOAT_MAT4X3:
            pp_Var16 = &gl->uniformMatrix4x3fv;
            break;
          case TYPE_FLOAT_MAT4:
            pp_Var16 = local_288;
            break;
          default:
            goto switchD_003b9595_default;
          }
          (**pp_Var16)(GVar4,uVar21,'\0',(GLfloat *)local_1f8._0_8_);
switchD_003b9595_default:
        } while (iVar5 == 0);
        if ((TestLog *)local_1f8._0_8_ != (TestLog *)0x0) {
          operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
        }
      }
      goto LAB_003b8f97;
    }
    deRandom_init((deRandom *)&local_260,0x324f);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1f8,(long)(int)(iVar5 * uVar21),&local_299
              );
    if (0 < (int)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 2)) {
      lVar11 = 0;
      do {
        dVar9 = deRandom_getBool((deRandom *)&local_260);
        *(uint *)((long)(qpTestLog **)local_1f8._0_8_ + lVar11 * 4) = (uint)(dVar9 == 1);
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 2));
    }
    iVar22 = 1;
    do {
      bVar24 = iVar22 == 0;
      iVar22 = iVar22 + -1;
      GVar4 = GVar6;
      if (bVar24) {
        GVar4 = GVar7;
      }
      pp_Var14 = &gl->uniform1iv;
      switch(iVar5) {
      case 1:
        break;
      case 2:
        pp_Var14 = &gl->uniform2iv;
        break;
      case 3:
        pp_Var14 = &gl->uniform3iv;
        break;
      case 4:
        pp_Var14 = &gl->uniform4iv;
        break;
      default:
        goto switchD_003b8f49_default;
      }
      (**pp_Var14)(GVar4,uVar21,(GLint *)local_1f8._0_8_);
switchD_003b8f49_default:
    } while (iVar22 == 0);
  }
  gl = local_298;
  if ((TestLog *)local_1f8._0_8_ != (TestLog *)0x0) {
    operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
    gl = local_298;
  }
LAB_003b8f97:
  GVar18 = (this->m_workGroupSize).m_data[0];
  lVar11 = 0;
  do {
    GVar18 = GVar18 * (this->m_workGroupSize).m_data[lVar11 + 1];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  (*gl->uniform1ui)(GVar8,GVar18);
  GVar10 = (*gl->getError)();
  glu::checkError(GVar10,"Input value setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x12a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8,
             (ulong)local_78.dataSize,(allocator_type *)&local_260);
  GVar18 = local_28c;
  if (local_1f8._0_8_ != local_1f8._8_8_) {
    memset((void *)local_1f8._0_8_,0,local_1f8._8_8_ - local_1f8._0_8_);
  }
  (*gl->bindBuffer)(0x90d2,local_210.m_object);
  (*gl->bufferData)(0x90d2,(ulong)local_78.dataSize,(void *)local_1f8._0_8_,0x88e5);
  (*gl->bindBufferBase)(0x90d2,0,local_210.m_object);
  GVar10 = (*gl->getError)();
  glu::checkError(GVar10,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x135);
  if ((TestLog *)local_1f8._0_8_ != (TestLog *)0x0) {
    operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
  }
  (*gl->dispatchCompute)(1,1,1);
  uVar21 = (this->m_workGroupSize).m_data[0];
  lVar11 = 0;
  do {
    uVar21 = uVar21 * (this->m_workGroupSize).m_data[lVar11 + 1];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  local_260.name._M_dataplus._M_p = (pointer)&local_260.name.field_2;
  local_260.name._M_string_length = 0;
  local_260.name.field_2._M_local_buf[0] = '\0';
  local_260.index = 0xffffffff;
  local_260.blockIndex = 0xffffffff;
  local_260.atomicCounterBufferIndex = 0xffffffff;
  local_260.type = 0;
  local_260.arraySize = 0;
  local_260.offset = 0;
  local_260.arrayStride = 0;
  local_260._60_5_ = 0;
  local_260._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo
            (gl,GVar18,0x92e5,
             *local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,&local_260);
  pvVar15 = (*gl->mapBufferRange)(0x90d2,0,(ulong)local_78.dataSize,1);
  GVar10 = (*gl->getError)();
  glu::checkError(GVar10,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x142);
  if (pvVar15 == (void *)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"resPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
               ,0x143);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (uVar21 == 0) {
    iVar5 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1f8 + 8);
    uVar17 = 0;
    iVar5 = 0;
    do {
      if (*(int *)((long)pvVar15 +
                  (ulong)(uint)(local_260.arrayStride * (int)uVar17) + (ulong)local_260.offset) == 0
         ) {
        if (iVar5 < 10) {
          local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: isOk[",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] = ",4);
          std::ostream::operator<<(poVar1,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," != true",8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_180);
        }
        else if (iVar5 == 10) {
          local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1f8 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f8 + 8));
          std::ios_base::~ios_base(local_180);
        }
        iVar5 = iVar5 + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar21 != uVar17);
  }
  (*local_298->unmapBuffer)(0x90d2);
  GVar10 = (*local_298->getError)();
  glu::checkError(GVar10,"glUnmapBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x155);
  local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1f8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_180);
  description = "Pass";
  if (iVar5 != 0) {
    description = "Comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar5 != 0),
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.name._M_dataplus._M_p != &local_260.name.field_2) {
    operator_delete(local_260.name._M_dataplus._M_p,
                    CONCAT71(local_260.name.field_2._M_allocated_capacity._1_7_,
                             local_260.name.field_2._M_local_buf[0]) + 1);
  }
  if ((deUint32 *)
      local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (deUint32 *)0x0) {
    operator_delete(local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p,
                    CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                             local_78.name.field_2._M_local_buf[0]) + 1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_210);
  return STOP;
}

Assistant:

SharedBasicVarCase::IterateResult SharedBasicVarCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	Buffer						outputBuffer	(m_context.getRenderContext());
	const deUint32				outBlockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "Result");
	const InterfaceBlockInfo	outBlockInfo	= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, outBlockNdx);

	gl.useProgram(program);

	// Setup input values.
	{
		const int		numValues		= (int)product(m_workGroupSize);
		const int		valLoc			= gl.getUniformLocation(program, "u_val[0]");
		const int		refLoc			= gl.getUniformLocation(program, "u_ref[0]");
		const int		iterCountLoc	= gl.getUniformLocation(program, "u_numIters");
		const int		scalarSize		= getDataTypeScalarSize(m_basicType);

		if (isDataTypeFloatOrVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1fv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2fv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3fv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4fv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeIntOrIVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 64 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = minInt + (ndx % (maxInt-minInt+1));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeUintOrUVec(m_basicType))
		{
			const deUint32		maxInt		= m_precision == glu::PRECISION_LOWP ? 128 : 1024;
			vector<deUint32>	values		(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = ndx % (maxInt+1);

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1uiv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2uiv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3uiv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4uiv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeBoolOrBVec(m_basicType))
		{
			de::Random		rnd				(0x324f);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = rnd.getBool() ? 1 : 0;

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeMatrix(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				switch (m_basicType)
				{
					case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv  (location, numValues, DE_FALSE, &values[0]);	break;
					default:
						DE_ASSERT(false);
				}
			}
		}

		gl.uniform1ui(iterCountLoc, product(m_workGroupSize));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Input value setup failed");
	}

	// Setup output buffer.
	{
		vector<deUint8> emptyData(outBlockInfo.dataSize);
		std::fill(emptyData.begin(), emptyData.end(), 0);

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, outBlockInfo.dataSize, &emptyData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(1, 1, 1);

	// Read back and compare
	{
		const deUint32				numValues	= product(m_workGroupSize);
		const InterfaceVariableInfo	outVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outBlockInfo.activeVariables[0]);
		const void*					resPtr		= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, outBlockInfo.dataSize, GL_MAP_READ_BIT);
		const int					maxErrMsg	= 10;
		int							numFailed	= 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
		{
			const int resVal = *((const int*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*ndx));

			if (resVal == 0)
			{
				if (numFailed < maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "ERROR: isOk[" << ndx << "] = " << resVal << " != true" << TestLog::EndMessage;
				else if (numFailed == maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.getLog() << TestLog::Message << (numValues-numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Comparison failed");
	}

	return STOP;
}